

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::EnumValueShortName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,EnumValueDescriptor *descriptor)

{
  string *__return_storage_ptr___00;
  EnumDescriptor *this_00;
  EnumDescriptor *descriptor_00;
  EnumValueDescriptor *descriptor_01;
  undefined1 local_88 [8];
  string long_name;
  undefined1 local_58 [8];
  string long_name_prefix;
  string class_name;
  EnumValueDescriptor *descriptor_local;
  
  this_00 = EnumValueDescriptor::type((EnumValueDescriptor *)this);
  __return_storage_ptr___00 = (string *)((long)&long_name_prefix.field_2 + 8);
  EnumName_abi_cxx11_(__return_storage_ptr___00,(objectivec *)this_00,descriptor_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 __return_storage_ptr___00,"_");
  EnumValueName_abi_cxx11_((string *)local_88,this,descriptor_01);
  StripPrefixString(__return_storage_ptr__,(string *)local_88,(string *)local_58);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(long_name_prefix.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string EnumValueShortName(const EnumValueDescriptor* descriptor) {
  // Enum value names (EnumValueName above) are the enum name turned into
  // a class name and then the value name is CamelCased and concatenated; the
  // whole thing then gets sanitized for reserved words.
  // The "short name" is intended to be the final leaf, the value name; but
  // you can't simply send that off to sanitize as that could result in it
  // getting modified when the full name didn't.  For example enum
  // "StorageModes" has a value "retain".  So the full name is
  // "StorageModes_Retain", but if we sanitize "retain" it would become
  // "RetainValue".
  // So the right way to get the short name is to take the full enum name
  // and then strip off the enum name (leaving the value name and anything
  // done by sanitize).
  const std::string class_name = EnumName(descriptor->type());
  const std::string long_name_prefix = class_name + "_";
  const std::string long_name = EnumValueName(descriptor);
  return StripPrefixString(long_name, long_name_prefix);
}